

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_summon_named(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict local_80;
  loc_conflict grid;
  char s [80];
  monster_group_info info;
  monster_race *r;
  wchar_t i;
  wchar_t r_idx;
  command_conflict *cmd_local;
  
  r._0_4_ = 0;
  info.index = L'\0';
  info.role = MON_GROUP_LEADER;
  _i = cmd;
  memset(s + 0x48,0,8);
  wVar2 = cmd_get_arg_number((command *)_i,"index",(int *)((long)&r + 4));
  if (wVar2 == L'\0') {
    if ((0 < r._4_4_) && (r._4_4_ < (int)(uint)z_info->r_max)) {
      info = (monster_group_info)(r_info + r._4_4_);
    }
  }
  else {
    memset(&grid,0,0x50);
    _Var1 = get_string("Summon which monster? ",(char *)&grid,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string((char *)&grid,(int *)((long)&r + 4));
    if (_Var1) {
      if ((0 < r._4_4_) && (r._4_4_ < (int)(uint)z_info->r_max)) {
        info = (monster_group_info)(r_info + r._4_4_);
      }
    }
    else {
      info = (monster_group_info)lookup_monster((char *)&grid);
    }
    if (info != (monster_group_info)0x0) {
      cmd_set_arg_number((command *)_i,"index",*(wchar_t *)((long)info + 8));
    }
  }
  if (info == (monster_group_info)0x0) {
    msg("No monster found.");
  }
  else {
    while (((int)r < 10 &&
           (wVar2 = scatter_ext(cave,(loc *)&local_80,L'\x01',player->grid,L'\x01',true,
                                square_isempty), wVar2 != L'\0'))) {
      _Var1 = place_new_monster((chunk *)cave,local_80,(monster_race *)info,true,true,
                                (monster_group_info)s._72_8_,'\x19');
      if (_Var1) {
        player->upkeep->redraw = player->upkeep->redraw | 0x410000;
        return;
      }
      r._0_4_ = (int)r + 1;
    }
    msg("Could not place monster.");
  }
  return;
}

Assistant:

void do_cmd_wiz_summon_named(struct command *cmd)
{
	int r_idx, i = 0;
	struct monster_race *r = NULL;
	struct monster_group_info info = { 0, 0 };

	if (cmd_get_arg_number(cmd, "index", &r_idx) == CMD_OK) {
		if (r_idx > 0 && r_idx < z_info->r_max) {
			r = &r_info[r_idx];
		}
	} else {
		char s[80] = "";

		if (!get_string("Summon which monster? ", s, sizeof(s))) return;
		/* See if an index was entered */
		if (get_int_from_string(s, &r_idx)) {
			if (r_idx > 0 && r_idx < z_info->r_max) {
				r = &r_info[r_idx];
			}
		} else {
			/* If not, find by name */
			r = lookup_monster(s);
		}
		if (r != NULL) {
			cmd_set_arg_number(cmd, "index", r->ridx);
		}
	}

	if (r == NULL) {
		msg("No monster found.");
		return;
	}

	/* Try 10 times */
	while (1) {
		struct loc grid;

		/* Pick an empty location. */
		if (i >= 10 || scatter_ext(cave, &grid, 1, player->grid, 1,
				true, square_isempty) == 0) {
			msg("Could not place monster.");
			break;
		}

		/* Try to place. */
		if (place_new_monster(cave, grid, r, true, true,
				info, ORIGIN_DROP_WIZARD)) {
			player->upkeep->redraw |= PR_MAP | PR_MONLIST;
			break;
		}

		++i;
	}
}